

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uint stbi__zreceive(stbi__zbuf *z,int n)

{
  uint uVar1;
  uint k;
  int n_local;
  stbi__zbuf *z_local;
  
  if (z->num_bits < n) {
    stbi__fill_bits(z);
  }
  uVar1 = z->code_buffer;
  z->code_buffer = z->code_buffer >> ((byte)n & 0x1f);
  z->num_bits = z->num_bits - n;
  return uVar1 & (1 << ((byte)n & 0x1f)) - 1U;
}

Assistant:

stbi_inline static unsigned int stbi__zreceive(stbi__zbuf *z, int n)
{
   unsigned int k;
   if (z->num_bits < n) stbi__fill_bits(z);
   k = z->code_buffer & ((1 << n) - 1);
   z->code_buffer >>= n;
   z->num_bits -= n;
   return k;
}